

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

void __thiscall
testing::internal::TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)>::
TypedExpectation(TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)> *this,
                FunctionMocker<pstore::serialize::archive::void_type_(const_int_&)> *owner,
                char *a_file,int a_line,string *a_source_text,ArgumentMatcherTuple *m)

{
  VTable *pVVar1;
  SharedPayloadBase *pSVar2;
  
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_001992a0;
  this->owner_ = owner;
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<const_int_&>_>.
  super__Head_base<0UL,_testing::Matcher<const_int_&>,_false>._M_head_impl.
  super_MatcherBase<const_int_&>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00198bc0;
  pVVar1 = (m->super__Tuple_impl<0UL,_testing::Matcher<const_int_&>_>).
           super__Head_base<0UL,_testing::Matcher<const_int_&>,_false>._M_head_impl.
           super_MatcherBase<const_int_&>.vtable_;
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<const_int_&>_>.
  super__Head_base<0UL,_testing::Matcher<const_int_&>,_false>._M_head_impl.
  super_MatcherBase<const_int_&>.vtable_ = pVVar1;
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<const_int_&>_>.
  super__Head_base<0UL,_testing::Matcher<const_int_&>,_false>._M_head_impl.
  super_MatcherBase<const_int_&>.buffer_ =
       (m->super__Tuple_impl<0UL,_testing::Matcher<const_int_&>_>).
       super__Head_base<0UL,_testing::Matcher<const_int_&>,_false>._M_head_impl.
       super_MatcherBase<const_int_&>.buffer_;
  if ((pVVar1 != (VTable *)0x0) &&
     (pVVar1->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    pSVar2 = (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<const_int_&>_>.
             super__Head_base<0UL,_testing::Matcher<const_int_&>,_false>._M_head_impl.
             super_MatcherBase<const_int_&>.buffer_.shared;
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<const_int_&>_>.
  super__Head_base<0UL,_testing::Matcher<const_int_&>,_false>._M_head_impl.
  super_MatcherBase<const_int_&>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00198b50;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<const_int_&>_&>.vtable_ =
       (VTable *)
       MatcherBase<std::tuple<int_const&>const&>::
       GetVTable<testing::internal::MatcherBase<std::tuple<int_const&>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<const_int_&>_&>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001992e8;
  *(undefined8 *)&(this->repeated_action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->repeated_action_).fun_.super__Function_base._M_functor + 8) = 0;
  (this->repeated_action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->repeated_action_).fun_._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

TypedExpectation(FunctionMocker<F>* owner, const char* a_file, int a_line,
                   const std::string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that causes ambiguity between
        // Matcher's copy and move constructor for some argument types.
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}